

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLStateMachine.cpp
# Opt level: O3

void __thiscall SQLStateMachine::SQLStateMachine(SQLStateMachine *this)

{
  int (*_table) [255];
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  BPlusTree<int> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Keyword *pKVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  ::BPlusTree((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
               *)this,false);
  this->last_state = 0;
  this_00 = &this->parse_states;
  BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::BPlusTree(&this_00->tree,false);
  this_01 = &this->quote_states;
  BPlusTree<int>::BPlusTree(this_01,false);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"SELECT","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = SELECT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"INSERT","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = INSERT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CREATE","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = CREATE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"INTO","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = INTO;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"FROM","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = FROM;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"WHERE","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = WHERE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TABLE","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = TABLE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"VALUES","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = VALUES;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"DROP","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = DROP;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TABLES","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = LIST_TABLES;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXIT","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = EXIT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXEC","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = EXEC;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"*","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = ASTERISK;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,",","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = COMMA;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"(","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = OPEN_PARENTH;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,")","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = CLOSE_PARENTH;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"=","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = RELATIONAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,">","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = RELATIONAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = RELATIONAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<=","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = RELATIONAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,">=","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = RELATIONAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"AND","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = LOGICAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"OR","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = LOGICAL_OPERATOR;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\"","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = QUOTE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"MAKE","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = CREATE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"FIELDS","");
  pKVar2 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
           ::operator[](&this->keywords,&local_48);
  *pKVar2 = FIELDS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  _table = this->state_table;
  state_machine::init_table(_table);
  state_machine::mark_fail(_table,0);
  state_machine::mark_fail(_table,1);
  state_machine::mark_fail(_table,2);
  state_machine::mark_fail(_table,3);
  state_machine::mark_fail(_table,4);
  state_machine::mark_fail(_table,5);
  state_machine::mark_success(_table,6);
  state_machine::mark_fail(_table,7);
  state_machine::mark_fail(_table,8);
  state_machine::mark_fail(_table,9);
  state_machine::mark_fail(_table,10);
  state_machine::mark_success(_table,0xb);
  state_machine::mark_fail(_table,0xc);
  state_machine::mark_fail(_table,0xd);
  state_machine::mark_fail(_table,0xe);
  state_machine::mark_fail(_table,0xf);
  state_machine::mark_fail(_table,0x10);
  state_machine::mark_fail(_table,0x11);
  state_machine::mark_fail(_table,0x12);
  state_machine::mark_success(_table,0x13);
  state_machine::mark_fail(_table,0x14);
  state_machine::mark_fail(_table,0x15);
  state_machine::mark_fail(_table,0x16);
  state_machine::mark_fail(_table,0x17);
  state_machine::mark_fail(_table,0x18);
  state_machine::mark_fail(_table,0x19);
  state_machine::mark_fail(_table,0x1a);
  state_machine::mark_success(_table,0x1b);
  state_machine::mark_fail(_table,0x1c);
  state_machine::mark_fail(_table,0x1d);
  state_machine::mark_fail(_table,0x1e);
  state_machine::mark_success(_table,0x1f);
  state_machine::mark_success(_table,0x20);
  state_machine::mark_fail(_table,0x21);
  state_machine::mark_fail(_table,0x22);
  state_machine::mark_fail(_table,0x23);
  state_machine::mark_fail(_table,0x24);
  state_machine::mark_fail(_table,0x25);
  state_machine::mark_fail(_table,0x26);
  state_machine::mark_fail(_table,0x27);
  state_machine::mark_fail(_table,0x28);
  state_machine::mark_fail(_table,0x29);
  state_machine::mark_fail(_table,0x2a);
  state_machine::mark_fail(_table,0x2b);
  state_machine::mark_fail(_table,0x2c);
  state_machine::mark_fail(_table,0x2d);
  state_machine::mark_fail(_table,0x2e);
  state_machine::mark_fail(_table,0x2f);
  state_machine::mark_fail(_table,0x30);
  state_machine::mark_fail(_table,0x31);
  state_machine::mark_fail(_table,0x32);
  state_machine::mark_success(_table,0x33);
  local_48._M_dataplus._M_p._0_4_ = 1;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a347);
  local_48._M_dataplus._M_p._0_4_ = 0xd;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a347);
  local_48._M_dataplus._M_p._0_4_ = 0x14;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a347);
  local_48._M_dataplus._M_p._0_4_ = 0x1d;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a347);
  local_48._M_dataplus._M_p._0_4_ = 0x20;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a347);
  local_48._M_dataplus._M_p._0_4_ = 0x32;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a347);
  local_48._M_dataplus._M_p._0_4_ = 2;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5cd);
  local_48._M_dataplus._M_p._0_4_ = 3;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5cd);
  local_48._M_dataplus._M_p._0_4_ = 0x11;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5cd);
  local_48._M_dataplus._M_p._0_4_ = 0x19;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5cd);
  local_48._M_dataplus._M_p._0_4_ = 0x33;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5cd);
  local_48._M_dataplus._M_p._0_4_ = 6;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5d4);
  local_48._M_dataplus._M_p._0_4_ = 0xf;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5d4);
  local_48._M_dataplus._M_p._0_4_ = 0x16;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5d4);
  local_48._M_dataplus._M_p._0_4_ = 0x1f;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5d4);
  local_48._M_dataplus._M_p._0_4_ = 9;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5df);
  local_48._M_dataplus._M_p._0_4_ = 10;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5df);
  local_48._M_dataplus._M_p._0_4_ = 0xb;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5df);
  local_48._M_dataplus._M_p._0_4_ = 0xc;
  pbVar3 = Map::
           Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(int *)&local_48);
  std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x11a5df);
  local_48._M_dataplus._M_p._0_4_ = 0x21;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x22;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x23;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x24;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x25;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x26;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x27;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x28;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x29;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x2a;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x2b;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x2c;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x2d;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x2e;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x2f;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x30;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  local_48._M_dataplus._M_p._0_4_ = 0x31;
  BPlusTree<int>::insert(this_01,(int *)&local_48);
  state_machine::mark_success(_table,0x19);
  state_machine::mark_success(_table,0x11);
  state_machine::mark_cell(0,_table,1,1);
  state_machine::mark_cell(1,_table,0xe,2);
  state_machine::mark_cell(1,_table,4,3);
  state_machine::mark_cell(4,_table,4,3);
  state_machine::mark_cell(5,_table,4,6);
  state_machine::mark_cell(8,_table,4,9);
  state_machine::mark_cell(10,_table,4,0xb);
  state_machine::mark_cell(0xc,_table,4,9);
  state_machine::mark_cell(3,_table,0xf,4);
  state_machine::mark_cell(2,_table,6,5);
  state_machine::mark_cell(3,_table,6,5);
  state_machine::mark_cell(6,_table,7,8);
  state_machine::mark_cell(9,_table,0x13,10);
  state_machine::mark_cell(0xb,_table,0x14,0xc);
  state_machine::mark_cell(5,_table,0x12,0x21);
  state_machine::mark_all(0x21,_table,0x22);
  state_machine::unmark_cell(0x21,_table,0x12);
  state_machine::mark_all(0x22,_table,0x22);
  state_machine::unmark_cell(0x22,_table,0x12);
  state_machine::mark_cell(0x22,_table,0x12,6);
  state_machine::mark_cell(8,_table,0x12,0x23);
  state_machine::mark_cell(0xc,_table,0x12,0x23);
  state_machine::mark_all(0x23,_table,0x24);
  state_machine::unmark_cell(0x23,_table,0x12);
  state_machine::mark_all(0x24,_table,0x24);
  state_machine::unmark_cell(0x24,_table,0x12);
  state_machine::mark_cell(0x24,_table,0x12,9);
  state_machine::mark_cell(10,_table,0x12,0x25);
  state_machine::mark_all(0x25,_table,0x26);
  state_machine::unmark_cell(0x25,_table,0x12);
  state_machine::mark_all(0x26,_table,0x26);
  state_machine::unmark_cell(0x26,_table,0x12);
  state_machine::mark_cell(0x26,_table,0x12,0xb);
  state_machine::mark_cell(0,_table,3,0xd);
  state_machine::mark_cell(0xd,_table,8,0xe);
  state_machine::mark_cell(0xf,_table,0x10,0x10);
  state_machine::mark_cell(0x11,_table,0x11,0x13);
  state_machine::mark_cell(0xe,_table,4,0xf);
  state_machine::mark_cell(0x10,_table,4,0x11);
  state_machine::mark_cell(0x12,_table,4,0x11);
  state_machine::mark_cell(0x11,_table,0xf,0x12);
  state_machine::mark_cell(0xd,_table,0x12,0x28);
  state_machine::mark_all(0x28,_table,0x29);
  state_machine::unmark_cell(0x28,_table,0x12);
  state_machine::mark_all(0x29,_table,0x29);
  state_machine::unmark_cell(0x29,_table,0x12);
  state_machine::mark_cell(0x29,_table,0x12,0xf);
  state_machine::mark_cell(0xf,_table,0x12,0x2a);
  state_machine::mark_cell(0x10,_table,0x12,0x2a);
  state_machine::mark_cell(0x12,_table,0x12,0x2a);
  state_machine::mark_all(0x2a,_table,0x2b);
  state_machine::unmark_cell(0x2a,_table,0x12);
  state_machine::mark_all(0x2b,_table,0x2b);
  state_machine::unmark_cell(0x2b,_table,0x12);
  state_machine::mark_cell(0x2b,_table,0x12,0x11);
  state_machine::mark_cell(0,_table,2,0x14);
  state_machine::mark_cell(0x14,_table,5,0x15);
  state_machine::mark_cell(0x15,_table,4,0x16);
  state_machine::mark_cell(0x18,_table,4,0x19);
  state_machine::mark_cell(0x1a,_table,4,0x19);
  state_machine::mark_cell(0x17,_table,0x10,0x18);
  state_machine::mark_cell(0x18,_table,0x11,0x1b);
  state_machine::mark_cell(0x19,_table,0x11,0x1b);
  state_machine::mark_cell(0x19,_table,0xf,0x1a);
  state_machine::mark_cell(0x16,_table,9,0x17);
  state_machine::mark_cell(0x14,_table,0x12,0x2c);
  state_machine::mark_all(0x2c,_table,0x2d);
  state_machine::unmark_cell(0x2c,_table,0x12);
  state_machine::mark_all(0x2d,_table,0x2d);
  state_machine::unmark_cell(0x2d,_table,0x12);
  state_machine::mark_cell(0x2d,_table,0x12,0x16);
  state_machine::mark_cell(0x17,_table,0x12,0x2e);
  state_machine::mark_cell(0x18,_table,0x12,0x2e);
  state_machine::mark_cell(0x1a,_table,0x12,0x2e);
  state_machine::mark_all(0x2e,_table,0x2f);
  state_machine::unmark_cell(0x2e,_table,0x12);
  state_machine::mark_all(0x2f,_table,0x2f);
  state_machine::unmark_cell(0x2f,_table,0x12);
  state_machine::mark_cell(0x2f,_table,0x12,0x19);
  state_machine::mark_cell(0,_table,10,0x1d);
  state_machine::mark_cell(0x1d,_table,8,0x1e);
  state_machine::mark_cell(0x1e,_table,4,0x1f);
  state_machine::mark_cell(0x14,_table,0x12,0x30);
  state_machine::mark_all(0x30,_table,0x31);
  state_machine::unmark_cell(0x30,_table,0x12);
  state_machine::mark_all(0x31,_table,0x31);
  state_machine::unmark_cell(0x31,_table,0x12);
  state_machine::mark_cell(0x31,_table,0x12,0x1f);
  state_machine::mark_cell(0,_table,0xb,0x20);
  state_machine::mark_cell(0,_table,0xd,0x20);
  state_machine::mark_cell(0,_table,0xc,0x32);
  state_machine::mark_all(0x32,_table,0x33);
  state_machine::mark_all(0x33,_table,0x33);
  state_machine::mark_cell(0x17,_table,4,0x19);
  state_machine::mark_cell(0xf,_table,0x15,0x1c);
  state_machine::mark_cell(0x1c,_table,4,0x11);
  return;
}

Assistant:

SQLStateMachine::SQLStateMachine() {
    // init keyword map
    keywords["SELECT"] = sql_parser::SELECT;
    keywords["INSERT"] = sql_parser::INSERT;
    keywords["CREATE"] = sql_parser::CREATE;
    keywords["INTO"] = sql_parser::INTO;
    keywords["FROM"] = sql_parser::FROM;
    keywords["WHERE"] = sql_parser::WHERE;
    keywords["TABLE"] = sql_parser::TABLE;
    keywords["VALUES"] = sql_parser::VALUES;
    keywords["DROP"] = sql_parser::DROP;
    keywords["TABLES"] = sql_parser::LIST_TABLES;
    keywords["EXIT"] = sql_parser::EXIT;
    keywords["EXEC"] = sql_parser::EXEC;
    keywords["*"] = sql_parser::ASTERISK;
    keywords[","] = sql_parser::COMMA;
    keywords["("] = sql_parser::OPEN_PARENTH;
    keywords[")"] = sql_parser::CLOSE_PARENTH;
    keywords["="] = sql_parser::RELATIONAL_OPERATOR;
    keywords[">"] = sql_parser::RELATIONAL_OPERATOR;
    keywords["<"] = sql_parser::RELATIONAL_OPERATOR;
    keywords["<="] = sql_parser::RELATIONAL_OPERATOR;
    keywords[">="] = sql_parser::RELATIONAL_OPERATOR;
    keywords["AND"] = sql_parser::LOGICAL_OPERATOR;
    keywords["OR"] = sql_parser::LOGICAL_OPERATOR;
    keywords["\""] = sql_parser::QUOTE;
    #ifdef ENABLE_NON_STANDARD_SQL
        keywords["MAKE"] = sql_parser::CREATE;
        keywords["FIELDS"] = sql_parser::FIELDS;
    #endif

    // init state table
    state_machine::init_table(state_table);
    state_machine::mark_fail(state_table, 0);
    state_machine::mark_fail(state_table, 1);
    state_machine::mark_fail(state_table, 2);
    state_machine::mark_fail(state_table, 3);
    state_machine::mark_fail(state_table, 4);
    state_machine::mark_fail(state_table, 5);
    state_machine::mark_success(state_table, 6);
    state_machine::mark_fail(state_table, 7);
    state_machine::mark_fail(state_table, 8);
    state_machine::mark_fail(state_table, 9);
    state_machine::mark_fail(state_table, 10);
    state_machine::mark_success(state_table, 11);
    state_machine::mark_fail(state_table, 12);
    state_machine::mark_fail(state_table, 13);
    state_machine::mark_fail(state_table, 14);
    state_machine::mark_fail(state_table, 15);
    state_machine::mark_fail(state_table, 16);
    state_machine::mark_fail(state_table, 17);
    state_machine::mark_fail(state_table, 18);
    state_machine::mark_success(state_table, 19);
    state_machine::mark_fail(state_table, 20);
    state_machine::mark_fail(state_table, 21);
    state_machine::mark_fail(state_table, 22);
    state_machine::mark_fail(state_table, 23);
    state_machine::mark_fail(state_table, 24);
    state_machine::mark_fail(state_table, 25);
    state_machine::mark_fail(state_table, 26);
    state_machine::mark_success(state_table, 27);
    state_machine::mark_fail(state_table, 28);
    state_machine::mark_fail(state_table, 29);
    state_machine::mark_fail(state_table, 30);
    state_machine::mark_success(state_table, 31);
    state_machine::mark_success(state_table, 32);
    state_machine::mark_fail(state_table, 33);
    state_machine::mark_fail(state_table, 34);
    state_machine::mark_fail(state_table, 35);
    state_machine::mark_fail(state_table, 36);
    state_machine::mark_fail(state_table, 37);
    state_machine::mark_fail(state_table, 38);
    state_machine::mark_fail(state_table, 39);
    state_machine::mark_fail(state_table, 40);
    state_machine::mark_fail(state_table, 41);
    state_machine::mark_fail(state_table, 42);
    state_machine::mark_fail(state_table, 43);
    state_machine::mark_fail(state_table, 44);
    state_machine::mark_fail(state_table, 45);
    state_machine::mark_fail(state_table, 46);
    state_machine::mark_fail(state_table, 47);
    state_machine::mark_fail(state_table, 48);
    state_machine::mark_fail(state_table, 49);
    state_machine::mark_fail(state_table, 50);
    state_machine::mark_success(state_table, 51);

    // this wont make any sense unless you look at the state diagram or the
    // state table spreadsheet

    // define states
    // command states
    // select
    parse_states[1] ="command";
    // create
    parse_states[13] = "command";
    // insert
    parse_states[20] = "command";
    // drop
    parse_states[29] = "command";
    // any 1 word commands i might want to add
    parse_states[32] = "command";
    // exec
    parse_states[50] = "command";

    // field states
    // select: asterisk
    parse_states[2] = "fields";
    // select: string
    parse_states[3] = "fields";
    // create: field name
    parse_states[17] = "fields";
    // insert: entry name
    parse_states[25] = "fields";
    // exec: filename
    parse_states[51] = "fields";

    // table name states
    // select: table name
    parse_states[6] = "table_name";
    // create: table name
    parse_states[15] = "table_name";
    // insert: table name
    parse_states[22] = "table_name";
    // drop: table name
    parse_states[31] = "table_name";

    // where states
    // field name
    parse_states[9] = "where";
    // relational
    parse_states[10] = "where";
    // entry name
    parse_states[11] = "where";
    // logical
    parse_states[12] = "where";

    // quote states
    quote_states.insert(33);
    quote_states.insert(34);
    quote_states.insert(35);
    quote_states.insert(36);
    quote_states.insert(37);
    quote_states.insert(38);
    quote_states.insert(39);
    quote_states.insert(40);
    quote_states.insert(41);
    quote_states.insert(42);
    quote_states.insert(43);
    quote_states.insert(44);
    quote_states.insert(45);
    quote_states.insert(46);
    quote_states.insert(47);
    quote_states.insert(48);
    quote_states.insert(49);

    #ifdef ENABLE_NON_STANDARD_SQL
        // insert command parenthesis skipping
        state_machine::mark_success(state_table, 25);
        // create command parenthesis skipping
        state_machine::mark_success(state_table, 17);
    #endif

    // mark cells
    // command: select
    state_machine::mark_cell(0, state_table, sql_parser::SELECT, 1);

    state_machine::mark_cell(1, state_table, sql_parser::ASTERISK, 2);

    state_machine::mark_cell(1, state_table, sql_parser::STRING, 3);
    state_machine::mark_cell(4, state_table, sql_parser::STRING, 3);
    state_machine::mark_cell(5, state_table, sql_parser::STRING, 6);
    state_machine::mark_cell(8, state_table, sql_parser::STRING, 9);
    state_machine::mark_cell(10, state_table, sql_parser::STRING, 11);
    state_machine::mark_cell(12, state_table, sql_parser::STRING, 9);

    state_machine::mark_cell(3, state_table, sql_parser::COMMA, 4);

    state_machine::mark_cell(2, state_table, sql_parser::FROM, 5);
    state_machine::mark_cell(3, state_table, sql_parser::FROM, 5);

    state_machine::mark_cell(6, state_table, sql_parser::WHERE, 8);

    state_machine::mark_cell(9, state_table, sql_parser::RELATIONAL_OPERATOR, 10);
    state_machine::mark_cell(11, state_table, sql_parser::LOGICAL_OPERATOR, 12);

    // handle all these quotes
    state_machine::mark_cell(5, state_table, sql_parser::QUOTE, 33);

    state_machine::mark_all(33, state_table, 34);
    state_machine::unmark_cell(33, state_table, sql_parser::QUOTE);

    state_machine::mark_all(34, state_table, 34);
    state_machine::unmark_cell(34, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(34, state_table, sql_parser::QUOTE, 6);


    state_machine::mark_cell(8, state_table, sql_parser::QUOTE, 35);
    state_machine::mark_cell(12, state_table, sql_parser::QUOTE, 35);

    state_machine::mark_all(35, state_table, 36);
    state_machine::unmark_cell(35, state_table, sql_parser::QUOTE);

    state_machine::mark_all(36, state_table, 36);
    state_machine::unmark_cell(36, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(36, state_table, sql_parser::QUOTE, 9);


    state_machine::mark_cell(10, state_table, sql_parser::QUOTE, 37);

    state_machine::mark_all(37, state_table, 38);
    state_machine::unmark_cell(37, state_table, sql_parser::QUOTE);

    state_machine::mark_all(38, state_table, 38);
    state_machine::unmark_cell(38, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(38, state_table, sql_parser::QUOTE, 11);


    // command: create
    state_machine::mark_cell(0, state_table, sql_parser::CREATE, 13);

    state_machine::mark_cell(13, state_table, sql_parser::TABLE, 14);

    state_machine::mark_cell(15, state_table, sql_parser::OPEN_PARENTH, 16);
    state_machine::mark_cell(17, state_table, sql_parser::CLOSE_PARENTH, 19);

    state_machine::mark_cell(14, state_table, sql_parser::STRING, 15);
    state_machine::mark_cell(16, state_table, sql_parser::STRING, 17);
    state_machine::mark_cell(18, state_table, sql_parser::STRING, 17);

    state_machine::mark_cell(17, state_table, sql_parser::COMMA, 18);

    // quotes
    state_machine::mark_cell(13, state_table, sql_parser::QUOTE, 40);

    state_machine::mark_all(40, state_table, 41);
    state_machine::unmark_cell(40, state_table, sql_parser::QUOTE);

    state_machine::mark_all(41, state_table, 41);
    state_machine::unmark_cell(41, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(41, state_table, sql_parser::QUOTE, 15);


    state_machine::mark_cell(15, state_table, sql_parser::QUOTE, 42);
    state_machine::mark_cell(16, state_table, sql_parser::QUOTE, 42);
    state_machine::mark_cell(18, state_table, sql_parser::QUOTE, 42);

    state_machine::mark_all(42, state_table, 43);
    state_machine::unmark_cell(42, state_table, sql_parser::QUOTE);

    state_machine::mark_all(43, state_table, 43);
    state_machine::unmark_cell(43, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(43, state_table, sql_parser::QUOTE, 17);

    // command: insert
    state_machine::mark_cell(0, state_table, sql_parser::INSERT, 20);

    state_machine::mark_cell(20, state_table, sql_parser::INTO, 21);

    state_machine::mark_cell(21, state_table, sql_parser::STRING, 22);
    state_machine::mark_cell(24, state_table, sql_parser::STRING, 25);
    state_machine::mark_cell(26, state_table, sql_parser::STRING, 25);
    // state_machine::mark_cell(27, state_table, sql_parser::STRING, 26);

    state_machine::mark_cell(23, state_table, sql_parser::OPEN_PARENTH, 24);
    state_machine::mark_cell(24, state_table, sql_parser::CLOSE_PARENTH, 27);
    state_machine::mark_cell(25, state_table, sql_parser::CLOSE_PARENTH, 27);

    state_machine::mark_cell(25, state_table, sql_parser::COMMA, 26);

    state_machine::mark_cell(22, state_table, sql_parser::VALUES, 23);

    // quotes
    state_machine::mark_cell(20, state_table, sql_parser::QUOTE, 44);

    state_machine::mark_all(44, state_table, 45);
    state_machine::unmark_cell(44, state_table, sql_parser::QUOTE);

    state_machine::mark_all(45, state_table, 45);
    state_machine::unmark_cell(45, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(45, state_table, sql_parser::QUOTE, 22);


    state_machine::mark_cell(23, state_table, sql_parser::QUOTE, 46);
    state_machine::mark_cell(24, state_table, sql_parser::QUOTE, 46);
    state_machine::mark_cell(26, state_table, sql_parser::QUOTE, 46);

    state_machine::mark_all(46, state_table, 47);
    state_machine::unmark_cell(46, state_table, sql_parser::QUOTE);

    state_machine::mark_all(47, state_table, 47);
    state_machine::unmark_cell(47, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(47, state_table, sql_parser::QUOTE, 25);

    // command: drop
    state_machine::mark_cell(0, state_table, sql_parser::DROP, 29);
    state_machine::mark_cell(29, state_table, sql_parser::TABLE, 30);
    state_machine::mark_cell(30, state_table, sql_parser::STRING, 31);

    state_machine::mark_cell(20, state_table, sql_parser::QUOTE, 48);

    state_machine::mark_all(48, state_table, 49);
    state_machine::unmark_cell(48, state_table, sql_parser::QUOTE);

    state_machine::mark_all(49, state_table, 49);
    state_machine::unmark_cell(49, state_table, sql_parser::QUOTE);

    state_machine::mark_cell(49, state_table, sql_parser::QUOTE, 31);

    // list tables
    state_machine::mark_cell(0, state_table, sql_parser::LIST_TABLES, 32);
    // exit
    state_machine::mark_cell(0, state_table, sql_parser::EXIT, 32);

    // execute file
    state_machine::mark_cell(0, state_table, sql_parser::EXEC, 50);
    state_machine::mark_all(50, state_table, 51);
    state_machine::mark_all(51, state_table, 51);


    #ifdef ENABLE_NON_STANDARD_SQL
        // insert command parenthesis skipping
        state_machine::mark_cell(23, state_table, sql_parser::STRING, 25);
        // create command field keyword
        state_machine::mark_cell(15, state_table, sql_parser::FIELDS, 28);
        state_machine::mark_cell(28, state_table, sql_parser::STRING, 17);
    #endif
}